

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::ArrayBuilder<kj::OwnFd>::dispose(ArrayBuilder<kj::OwnFd> *this)

{
  OwnFd *pOVar1;
  RemoveConst<kj::OwnFd> *pRVar2;
  OwnFd *pOVar3;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (OwnFd *)0x0) {
    pRVar2 = this->pos;
    pOVar3 = this->endPtr;
    this->endPtr = (OwnFd *)0x0;
    this->ptr = (OwnFd *)0x0;
    this->pos = (RemoveConst<kj::OwnFd> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pOVar1,4,(long)pRVar2 - (long)pOVar1 >> 2,
               (long)pOVar3 - (long)pOVar1 >> 2,ArrayDisposer::Dispose_<kj::OwnFd>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }